

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O3

int P_Char_match<P_CharExact>(P_CharExact *p,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  pointer this;
  
  this = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.super__Vector_impl_data.
         _M_finish + -1;
  iVar3 = State::nextChar(&this->st);
  if ((p->c == iVar3) && (bVar2 = State::canAdvance(&this->st), bVar2)) {
    State::advance(&this->st);
    piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].iseq;
    *piVar1 = *piVar1 + 1;
    return 0;
  }
  std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  return 0;
}

Assistant:

int P_Char_match(const P& p, vector<StateP> &stk) {
    State &st = stk.back().st;
    if (p.testch(st.nextChar()) && st.canAdvance()) {
        st.advance();
        stk.back().iseq++;
    } else {
        stk.pop_back();
    }
    return 0;
}